

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_utilities.h
# Opt level: O1

point __thiscall
dlib::max_point<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>
          (dlib *this,
          matrix_exp<dlib::matrix_op<dlib::op_subm<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
          *m)

{
  float fVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  point *best_point;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [64];
  point pVar10;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar5 = *(long *)this;
  lVar4 = *(long *)(this + 8);
  if (0 < *(long *)(m + 0x18)) {
    lVar2 = (*(long **)m)[3];
    lVar6 = **(long **)m;
    lVar7 = *(long *)(m + 0x10) * 4 + *(long *)(m + 8) * lVar2 * 4;
    auVar9 = ZEXT464(*(uint *)(lVar6 + lVar7));
    lVar6 = lVar6 + lVar7;
    lVar7 = 0;
    do {
      if (0 < *(long *)(m + 0x20)) {
        lVar8 = 0;
        do {
          fVar1 = *(float *)(lVar6 + lVar8 * 4);
          if (auVar9._0_4_ < fVar1) {
            lVar5 = lVar8;
            lVar4 = lVar7;
          }
          auVar3 = vmaxss_avx(ZEXT416((uint)fVar1),auVar9._0_16_);
          auVar9 = ZEXT1664(auVar3);
          lVar8 = lVar8 + 1;
        } while (*(long *)(m + 0x20) != lVar8);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + lVar2 * 4;
    } while (lVar7 != *(long *)(m + 0x18));
  }
  *(long *)this = lVar5;
  *(long *)(this + 8) = lVar4;
  pVar10.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[1] = lVar5;
  pVar10.
  super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>.
  data.data[0] = (long)this;
  return (point)pVar10.
                super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                .data.data;
}

Assistant:

point max_point (
        const matrix_exp<EXP>& m
    )
    {
        DLIB_ASSERT(m.size() > 0, 
            "\tpoint max_point(const matrix_exp& m)"
            << "\n\tm can't be empty"
            << "\n\tm.size():   " << m.size() 
            << "\n\tm.nr():     " << m.nr() 
            << "\n\tm.nc():     " << m.nc() 
            );
        typedef typename matrix_exp<EXP>::type type;

        point best_point(0,0);
        type val = m(0,0);
        for (long r = 0; r < m.nr(); ++r)
        {
            for (long c = 0; c < m.nc(); ++c)
            {
                type temp = m(r,c);
                if (dlib::impl::magnitude(temp) > dlib::impl::magnitude(val))
                {
                    val = temp;
                    best_point = point(c,r);
                }
            }
        }
        return best_point;
    }